

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * adios2sys::SystemTools::DecodeURL(string *__return_storage_ptr__,string *url)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  char bytes [3];
  undefined5 uStack_27d;
  RegularExpression urlByteRe;
  
  RegularExpression::RegularExpression(&urlByteRe,"%[0-9a-fA-F][0-9a-fA-F]");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar3 = 0; uVar3 < url->_M_string_length; uVar3 = uVar3 + 1) {
    std::__cxx11::string::substr((ulong)bytes,(ulong)url);
    bVar2 = RegularExpression::find
                      (&urlByteRe,
                       (char *)CONCAT53(uStack_27d,CONCAT12(bytes[2],CONCAT11(bytes[1],bytes[0]))));
    std::__cxx11::string::~string((string *)bytes);
    if (bVar2) {
      pcVar1 = (url->_M_dataplus)._M_p;
      bytes[0] = pcVar1[uVar3 + 1];
      bytes[1] = pcVar1[uVar3 + 2];
      bytes[2] = '\0';
      strtoul(bytes,(char **)0x0,0x10);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar3 = uVar3 + 2;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  RegularExpression::~RegularExpression(&urlByteRe);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::DecodeURL(const std::string& url)
{
  kwsys::RegularExpression urlByteRe(VTK_URL_BYTE_REGEX);
  std::string ret;
  for (size_t i = 0; i < url.length(); i++) {
    if (urlByteRe.find(url.substr(i, 3))) {
      char bytes[] = { url[i + 1], url[i + 2], '\0' };
      ret += static_cast<char>(strtoul(bytes, nullptr, 16));
      i += 2;
    } else {
      ret += url[i];
    }
  }
  return ret;
}